

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

void duckdb::DatePart::StructOperator::Operation<duckdb::interval_t>
               (bigint_vec *bigint_values,double_vec *double_values,interval_t *input,idx_t idx,
               part_mask_t mask)

{
  value_type plVar1;
  value_type pdVar2;
  uint uVar3;
  reference pplVar4;
  reference ppdVar5;
  long lVar6;
  int iVar7;
  vector<double_*,_std::allocator<double_*>_> local_168;
  vector<long_*,_std::allocator<long_*>_> local_150;
  vector<long_*,_std::allocator<long_*>_> local_138;
  vector<long_*,_std::allocator<long_*>_> local_120;
  vector<long_*,_std::allocator<long_*>_> local_108;
  vector<long_*,_std::allocator<long_*>_> local_f0;
  vector<long_*,_std::allocator<long_*>_> local_d8;
  vector<long_*,_std::allocator<long_*>_> local_c0;
  vector<long_*,_std::allocator<long_*>_> local_a8;
  vector<long_*,_std::allocator<long_*>_> local_90;
  vector<long_*,_std::allocator<long_*>_> local_78;
  vector<long_*,_std::allocator<long_*>_> local_60;
  vector<long_*,_std::allocator<long_*>_> local_48;
  
  if ((mask & 1) != 0) {
    iVar7 = input->months;
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_48,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_48,0);
    plVar1 = *pplVar4;
    if (local_48.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(input->months / 0xc);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_60,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_60,1);
    plVar1 = *pplVar4;
    if (local_60.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar7 = iVar7 + (((uint)(iVar7 / 6 + (iVar7 >> 0x1f)) >> 1) - (iVar7 >> 0x1f)) * -0xc;
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)iVar7;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_78,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_78,2);
    plVar1 = *pplVar4;
    if (local_78.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)input->days;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_90,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_90,3);
    plVar1 = *pplVar4;
    if (local_90.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(input->months / 0x78);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_a8,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_a8,4);
    plVar1 = *pplVar4;
    if (local_a8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(input->months / 0x4b0);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_c0,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_c0,5);
    plVar1 = *pplVar4;
    if (local_c0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(input->months / 12000);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_d8,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_d8,0xf);
    plVar1 = *pplVar4;
    if (local_d8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      uVar3 = (char)iVar7 * 0x56;
      plVar1[idx] = (long)(char)((char)((uVar3 & 0xffff) >> 0xf) + (char)(uVar3 >> 8) + '\x01');
    }
  }
  if ((mask & 0x10) != 0) {
    lVar6 = input->micros;
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_f0,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_f0,6);
    plVar1 = *pplVar4;
    if (local_f0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    lVar6 = lVar6 % 60000000;
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = lVar6;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_108,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_108,7);
    plVar1 = *pplVar4;
    if (local_108.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar7 = (int)lVar6;
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(iVar7 / 1000);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_120,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_120,8);
    plVar1 = *pplVar4;
    if (local_120.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (long)(iVar7 / 1000000);
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_138,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_138,9);
    plVar1 = *pplVar4;
    if (local_138.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = (input->micros % 3600000000) / 60000000;
    }
    ::std::vector<long_*,_std::allocator<long_*>_>::vector
              (&local_150,&bigint_values->super_vector<long_*,_std::allocator<long_*>_>);
    pplVar4 = vector<long_*,_true>::operator[]((vector<long_*,_true> *)&local_150,10);
    plVar1 = *pplVar4;
    if (local_150.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.super__Vector_base<long_*,_std::allocator<long_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (plVar1 != (value_type)0x0) {
      plVar1[idx] = input->micros / 3600000000;
    }
  }
  if ((mask & 8) != 0) {
    ::std::vector<double_*,_std::allocator<double_*>_>::vector
              (&local_168,&double_values->super_vector<double_*,_std::allocator<double_*>_>);
    ppdVar5 = vector<double_*,_true>::operator[]((vector<double_*,_true> *)&local_168,0);
    pdVar2 = *ppdVar5;
    if (local_168.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (pdVar2 != (value_type)0x0) {
      lVar6._0_4_ = input->months;
      lVar6._4_4_ = input->days;
      iVar7 = ((int)(undefined4)lVar6 / 6 + ((int)(undefined4)lVar6 >> 0x1f) >> 1) -
              ((int)(undefined4)lVar6 >> 0x1f);
      pdVar2[idx] = (double)input->micros / 1000000.0 +
                    (double)((lVar6 >> 0x20) * 0x15180 + (long)iVar7 * 0x1e187e0 +
                            (long)(((undefined4)lVar6 + iVar7 * -0xc) * 0x1e) * 0x15180);
    }
  }
  return;
}

Assistant:

void DatePart::StructOperator::Operation(bigint_vec &bigint_values, double_vec &double_values, const interval_t &input,
                                         const idx_t idx, const part_mask_t mask) {
	int64_t *part_data;
	if (mask & YMD) {
		const auto mm = input.months % Interval::MONTHS_PER_YEAR;
		part_data = HasPartValue(bigint_values, DatePartSpecifier::YEAR);
		if (part_data) {
			part_data[idx] = input.months / Interval::MONTHS_PER_YEAR;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MONTH);
		if (part_data) {
			part_data[idx] = mm;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::DAY);
		if (part_data) {
			part_data[idx] = input.days;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::DECADE);
		if (part_data) {
			part_data[idx] = input.months / Interval::MONTHS_PER_DECADE;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::CENTURY);
		if (part_data) {
			part_data[idx] = input.months / Interval::MONTHS_PER_CENTURY;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MILLENNIUM);
		if (part_data) {
			part_data[idx] = input.months / Interval::MONTHS_PER_MILLENIUM;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::QUARTER);
		if (part_data) {
			part_data[idx] = mm / Interval::MONTHS_PER_QUARTER + 1;
		}
	}

	if (mask & TIME) {
		const auto micros = MicrosecondsOperator::Operation<interval_t, int64_t>(input);
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MICROSECONDS);
		if (part_data) {
			part_data[idx] = micros;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MILLISECONDS);
		if (part_data) {
			part_data[idx] = micros / Interval::MICROS_PER_MSEC;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::SECOND);
		if (part_data) {
			part_data[idx] = micros / Interval::MICROS_PER_SEC;
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::MINUTE);
		if (part_data) {
			part_data[idx] = MinutesOperator::Operation<interval_t, int64_t>(input);
		}
		part_data = HasPartValue(bigint_values, DatePartSpecifier::HOUR);
		if (part_data) {
			part_data[idx] = HoursOperator::Operation<interval_t, int64_t>(input);
		}
	}

	if (mask & EPOCH) {
		auto part_data = HasPartValue(double_values, DatePartSpecifier::EPOCH);
		if (part_data) {
			part_data[idx] = EpochOperator::Operation<interval_t, double>(input);
		}
	}
}